

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::Columns(int columns_count,char *id,bool border)

{
  ImGuiWindow *pIVar1;
  ImGuiColumnsFlags flags;
  ImGuiWindow *window;
  bool border_local;
  char *id_local;
  int columns_count_local;
  
  pIVar1 = GetCurrentWindow();
  if (0 < columns_count) {
    if ((((pIVar1->DC).ColumnsSet == (ImGuiColumnsSet *)0x0) ||
        (((pIVar1->DC).ColumnsSet)->Count != columns_count)) ||
       (((pIVar1->DC).ColumnsSet)->Flags != (uint)!border)) {
      if ((pIVar1->DC).ColumnsSet != (ImGuiColumnsSet *)0x0) {
        EndColumns();
      }
      if (columns_count != 1) {
        BeginColumns(id,columns_count,(uint)!border);
      }
    }
    return;
  }
  __assert_fail("columns_count >= 1",
                "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                ,0x32d5,"void ImGui::Columns(int, const char *, bool)");
}

Assistant:

void ImGui::Columns(int columns_count, const char* id, bool border)
{
    ImGuiWindow* window = GetCurrentWindow();
    IM_ASSERT(columns_count >= 1);

    ImGuiColumnsFlags flags = (border ? 0 : ImGuiColumnsFlags_NoBorder);
    //flags |= ImGuiColumnsFlags_NoPreserveWidths; // NB: Legacy behavior
    if (window->DC.ColumnsSet != NULL && window->DC.ColumnsSet->Count == columns_count && window->DC.ColumnsSet->Flags == flags)
        return;

    if (window->DC.ColumnsSet != NULL)
        EndColumns();

    if (columns_count != 1)
        BeginColumns(id, columns_count, flags);
}